

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

uint64_t sum_quotients<unsigned_int,libdivide::divider<unsigned_int,(libdivide::Branching)1>>
                   (random_numerators<unsigned_int> *vals,
                   divider<unsigned_int,_(libdivide::Branching)1> *div)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint64_t xl;
  int iVar4;
  
  uVar2 = 0;
  if ((ulong)vals->_length != 0) {
    lVar3 = 0;
    do {
      uVar1 = *(uint *)((long)vals->_pData + lVar3);
      lVar3 = lVar3 + 4;
      iVar4 = (int)((ulong)uVar1 * (ulong)(div->div).denom.magic >> 0x20);
      uVar1 = (int)uVar2 + ((uVar1 - iVar4 >> 1) + iVar4 >> ((div->div).denom.more & 0x1f));
      uVar2 = (ulong)uVar1;
    } while ((ulong)vals->_length << 2 != lVar3);
    uVar2 = (ulong)uVar1;
  }
  return uVar2;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}